

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGccDepfileReader.cxx
# Opt level: O2

int testGccDepfileReader(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  uint __val;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dst;
  cmGccStyleDependency *this;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  cmGccDepfileContent expected;
  optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_> actual;
  uint local_340;
  cmGccStyleDependency dep;
  string plainDepfile;
  string depfile;
  string line;
  undefined1 local_2a8 [24];
  pointer pbStack_290;
  pointer local_288;
  pointer pbStack_280;
  string base;
  string dataDirPath;
  ifstream is;
  undefined1 local_228 [504];
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Invalid arguments.\n");
    local_340 = 0xffffffff;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dataDirPath,argv[1],(allocator<char> *)&is);
    std::__cxx11::string::append((char *)&dataDirPath);
    __val = 1;
    local_340 = 0;
    while( true ) {
      if (__val == 8) break;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is,
                     &dataDirPath,"/deps");
      std::__cxx11::to_string((string *)&dep,__val);
      std::operator+(&base,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dep);
      std::__cxx11::string::~string((string *)&dep);
      std::__cxx11::string::~string((string *)&is);
      std::operator+(&depfile,&base,".d");
      std::operator+(&plainDepfile,&base,".txt");
      poVar4 = std::operator<<((ostream *)&std::cout,"Comparing ");
      poVar4 = std::operator<<(poVar4,(string *)&base);
      poVar4 = std::operator<<(poVar4," with ");
      poVar4 = std::operator<<(poVar4,(string *)&plainDepfile);
      std::endl<char,std::char_traits<char>>(poVar4);
      _is = (_func_int **)local_228;
      local_228[0] = 0;
      cmReadGccDepfile(&actual,depfile._M_dataplus._M_p,(string *)&is,All);
      std::__cxx11::string::~string((string *)&is);
      bVar1 = cmsys::SystemTools::FileExists(&plainDepfile);
      if (bVar1) {
        if (actual.
            super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
            ._M_engaged == false) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Reading ");
          poVar4 = std::operator<<(poVar4,(string *)&depfile);
          pcVar6 = " should have succeeded\n";
          goto LAB_00199af5;
        }
        expected.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expected.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        expected.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::ifstream::ifstream((istream *)&is,plainDepfile._M_dataplus._M_p,_S_in);
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 != '\0') {
          line._M_dataplus._M_p = (pointer)&line.field_2;
          line._M_string_length = 0;
          line.field_2._M_local_buf[0] = '\0';
          dep.paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          dep.paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dep.rules.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dep.paths.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          dep.rules.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          dep.rules.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          bVar1 = true;
LAB_00199887:
          do {
            this = (cmGccStyleDependency *)&dep.paths;
            if (bVar1 != false) {
              this = &dep;
            }
            while( true ) {
              bVar1 = cmsys::SystemTools::GetLineFromStream
                                ((istream *)&is,&line,(bool *)0x0,0xffffffffffffffff);
              if (!bVar1) {
                if (dep.rules.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    dep.rules.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::
                  emplace_back<cmGccStyleDependency>(&expected,&dep);
                }
                cmGccStyleDependency::~cmGccStyleDependency(&dep);
                std::__cxx11::string::~string((string *)&line);
                goto LAB_001999ae;
              }
              bVar1 = std::operator==(&line,"--RULES--");
              if (bVar1) break;
              bVar3 = std::operator==(&line,"--DEPENDENCIES--");
              if (bVar3) goto LAB_00199887;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                         &line);
              local_2a8._0_8_ = local_2a8 + 0x10;
              local_2a8._8_8_ = (pointer)0x0;
              local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffffffffff00;
              std::__cxx11::string::operator=((string *)&line,(string *)local_2a8);
              std::__cxx11::string::~string((string *)local_2a8);
            }
            if (dep.rules.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                dep.rules.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::
              emplace_back<cmGccStyleDependency>(&expected,&dep);
              local_288 = (pointer)0x0;
              pbStack_280 = (pointer)0x0;
              local_2a8._16_8_ = (pointer)0x0;
              pbStack_290 = (pointer)0x0;
              local_2a8._0_8_ = (pointer)0x0;
              local_2a8._8_8_ = (pointer)0x0;
              cmGccStyleDependency::operator=(&dep,(cmGccStyleDependency *)local_2a8);
              cmGccStyleDependency::~cmGccStyleDependency((cmGccStyleDependency *)local_2a8);
            }
          } while( true );
        }
LAB_001999ae:
        std::ifstream::~ifstream((istream *)&is);
        if ((long)actual.
                  super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                  ._M_payload._M_value.
                  super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            actual.
            super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
            ._M_payload._0_8_ ==
            (long)expected.
                  super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)expected.
                  super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
          lVar7 = 0x18;
          uVar5 = 0xffffffffffffffff;
          while (uVar5 = uVar5 + 1,
                uVar5 < (ulong)(((long)actual.
                                       super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                                       ._M_payload._M_value.
                                       super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                actual.
                                super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                                ._M_payload._0_8_) / 0x30)) {
            bVar1 = anon_unknown.dwarf_76796::compare
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)actual.
                                         super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                                         ._M_payload._M_value.
                                         super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x18),
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)expected.
                                         super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x18),
                               "Rules differ: ");
            if (!bVar1) goto LAB_00199b7d;
            bVar1 = anon_unknown.dwarf_76796::compare
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&((actual.
                                            super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->rules).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar7),
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&((expected.
                                            super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->rules).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar7),
                               "Paths differ: ");
            lVar7 = lVar7 + 0x30;
            if (!bVar1) goto LAB_00199b7d;
          }
          std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
                    (&expected);
          goto LAB_00199a60;
        }
        poVar4 = std::operator<<((ostream *)&std::cerr,"Expected ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," entries.");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"Actual number of entries: ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
LAB_00199b7d:
        anon_unknown.dwarf_76796::dump("actual",(cmGccDepfileContent *)&actual);
        anon_unknown.dwarf_76796::dump("expected",&expected);
        std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector(&expected)
        ;
LAB_00199bad:
        local_340 = (uint)(__val < 8);
        std::
        _Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
        ::_M_reset((_Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                    *)&actual);
        std::__cxx11::string::~string((string *)&plainDepfile);
        std::__cxx11::string::~string((string *)&depfile);
        std::__cxx11::string::~string((string *)&base);
        break;
      }
      if (actual.
          super__Optional_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
          ._M_engaged != false) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Reading ");
        poVar4 = std::operator<<(poVar4,(string *)&depfile);
        pcVar6 = " should have failed\n";
LAB_00199af5:
        std::operator<<(poVar4,pcVar6);
        goto LAB_00199bad;
      }
LAB_00199a60:
      std::
      _Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
      ::_M_reset((_Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                  *)&actual);
      std::__cxx11::string::~string((string *)&plainDepfile);
      std::__cxx11::string::~string((string *)&depfile);
      std::__cxx11::string::~string((string *)&base);
      __val = __val + 1;
    }
    std::__cxx11::string::~string((string *)&dataDirPath);
  }
  return local_340;
}

Assistant:

int testGccDepfileReader(int argc, char* argv[])
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  std::string dataDirPath = argv[1];
  dataDirPath += "/testGccDepfileReader_data";
  const int numberOfTestFiles = 7; // 6th file doesn't exist
  for (int i = 1; i <= numberOfTestFiles; ++i) {
    const std::string base = dataDirPath + "/deps" + std::to_string(i);
    const std::string depfile = base + ".d";
    const std::string plainDepfile = base + ".txt";
    std::cout << "Comparing " << base << " with " << plainDepfile << std::endl;
    const auto actual = cmReadGccDepfile(depfile.c_str());
    if (cmSystemTools::FileExists(plainDepfile)) {
      if (!actual) {
        std::cerr << "Reading " << depfile << " should have succeeded\n";
        return 1;
      }
      const auto expected = readPlainDepfile(plainDepfile.c_str());
      if (!compare(*actual, expected)) {
        dump("actual", *actual);
        dump("expected", expected);
        return 1;
      }
    } else if (actual) {
      std::cerr << "Reading " << depfile << " should have failed\n";
      return 1;
    }
  }

  return 0;
}